

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomimp.cpp
# Opt level: O3

int AF_A_TroopAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  PClassActor *type;
  AActor *self;
  AActor *pAVar8;
  char *__assertion;
  bool bVar9;
  FName local_38;
  FSoundID local_34;
  DAngle local_30;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bb563;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bb553;
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_005bb34d;
    pPVar7 = (self->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
      (self->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar9 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar3 && bVar9) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar3) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar9) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bb563;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_005bb553;
LAB_005bb34d:
    self = (AActor *)0x0;
  }
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bb553:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bb563;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar7 = (PClass *)puVar2[1];
          if (pPVar7 == (PClass *)0x0) {
            pPVar7 = (PClass *)(**(code **)*puVar2)(puVar2);
            puVar2[1] = pPVar7;
          }
          bVar9 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar3 && bVar9) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar9 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar3) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar9) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bb563;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005bb553;
    }
    if (((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bb563:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomimp.cpp"
                    ,0x14,"int AF_A_TroopAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  A_FaceTarget(self);
  bVar9 = AActor::CheckMeleeRange(self);
  if (!bVar9) {
    pAVar8 = (self->target).field_0.p;
    if (pAVar8 != (AActor *)0x0) {
      if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005bb528;
      (self->target).field_0.p = (AActor *)0x0;
    }
    pAVar8 = (AActor *)0x0;
LAB_005bb528:
    type = PClass::FindActor("DoomImpBall");
    P_SpawnMissile(self,pAVar8,type,(AActor *)0x0);
    return 0;
  }
  uVar5 = FRandom::GenRand32(&pr_troopattack);
  iVar4 = (uVar5 & 7) * 3 + 3;
  local_34.ID = S_FindSound("imp/melee");
  S_Sound(self,1,&local_34,1.0,1.0);
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 == (AActor *)0x0) {
LAB_005bb49c:
    pAVar8 = (AActor *)0x0;
  }
  else if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_005bb49c;
  }
  local_38.Index = 0x84;
  local_30.Degrees = 0.0;
  iVar6 = P_DamageMobj(pAVar8,self,self,iVar4,&local_38,0,&local_30);
  if (0 < iVar6) {
    iVar4 = iVar6;
  }
  pAVar8 = (self->target).field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005bb4ee;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar8 = (AActor *)0x0;
LAB_005bb4ee:
  P_TraceBleed(iVar4,pAVar8,self);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_TroopAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = (pr_troopattack()%8+1)*3;
		S_Sound (self, CHAN_WEAPON, "imp/melee", 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
		return 0;
	}
	
	// launch a missile
	P_SpawnMissile (self, self->target, PClass::FindActor("DoomImpBall"));
	return 0;
}